

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitPositionOperator,bool,false,true>
               (string_t *ldata,string_t *rdata,int *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  unsigned_long *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  ulong uVar20;
  int iVar21;
  idx_t iVar22;
  idx_t iVar23;
  ulong uVar24;
  ulong uVar25;
  char **ppcVar26;
  ulong uVar27;
  ulong uVar28;
  bitstring_t substring;
  bitstring_t substring_00;
  bitstring_t substring_01;
  bitstring_t bits;
  bitstring_t bits_00;
  bitstring_t bits_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar7 = *(undefined8 *)&rdata->value;
      ppcVar26 = &(ldata->value).pointer.ptr;
      iVar22 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar26 + -1);
        uVar4 = paVar1->length;
        uVar10 = paVar1->prefix[0];
        uVar13 = paVar1->prefix[1];
        uVar16 = paVar1->prefix[2];
        uVar19 = paVar1->prefix[3];
        substring_01.value.pointer.prefix[3] = uVar19;
        substring_01.value.pointer.prefix[2] = uVar16;
        substring_01.value.pointer.prefix[1] = uVar13;
        substring_01.value.pointer.prefix[0] = uVar10;
        substring_01.value.pointer.length = uVar4;
        iVar21 = 0;
        if ((uint)uVar4 <= (uint)uVar7) {
          substring_01.value.pointer.ptr = *ppcVar26;
          bits_01.value.pointer.ptr = (rdata->value).pointer.ptr;
          bits_01.value._0_8_ = uVar7;
          iVar23 = Bit::BitPosition(substring_01,bits_01);
          iVar21 = (int)iVar23;
        }
        result_data[iVar22] = iVar21;
        iVar22 = iVar22 + 1;
        ppcVar26 = ppcVar26 + 2;
      } while (count != iVar22);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar25 = 0;
    uVar24 = 0;
    do {
      puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        uVar27 = uVar25 + 0x40;
        if (count <= uVar25 + 0x40) {
          uVar27 = count;
        }
LAB_01abcb2e:
        uVar20 = uVar25;
        if (uVar25 < uVar27) {
          uVar7 = *(undefined8 *)&rdata->value;
          ppcVar26 = &ldata[uVar25].value.pointer.ptr;
          do {
            paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar26 + -1);
            uVar2 = paVar1->length;
            uVar8 = paVar1->prefix[0];
            uVar11 = paVar1->prefix[1];
            uVar14 = paVar1->prefix[2];
            uVar17 = paVar1->prefix[3];
            substring.value.pointer.prefix[3] = uVar17;
            substring.value.pointer.prefix[2] = uVar14;
            substring.value.pointer.prefix[1] = uVar11;
            substring.value.pointer.prefix[0] = uVar8;
            substring.value.pointer.length = uVar2;
            iVar21 = 0;
            if ((uint)uVar2 <= (uint)uVar7) {
              substring.value.pointer.ptr = *ppcVar26;
              bits.value.pointer.ptr = (rdata->value).pointer.ptr;
              bits.value._0_8_ = uVar7;
              iVar22 = Bit::BitPosition(substring,bits);
              iVar21 = (int)iVar22;
            }
            result_data[uVar25] = iVar21;
            uVar25 = uVar25 + 1;
            ppcVar26 = ppcVar26 + 2;
            uVar20 = uVar27;
          } while (uVar27 != uVar25);
        }
      }
      else {
        uVar6 = puVar5[uVar24];
        uVar27 = uVar25 + 0x40;
        if (count <= uVar25 + 0x40) {
          uVar27 = count;
        }
        uVar20 = uVar27;
        if (uVar6 != 0) {
          if (uVar6 == 0xffffffffffffffff) goto LAB_01abcb2e;
          uVar20 = uVar25;
          if (uVar25 < uVar27) {
            ppcVar26 = &ldata[uVar25].value.pointer.ptr;
            uVar28 = 0;
            do {
              if ((uVar6 >> (uVar28 & 0x3f) & 1) != 0) {
                paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar26 + -1);
                uVar3 = paVar1->length;
                uVar9 = paVar1->prefix[0];
                uVar12 = paVar1->prefix[1];
                uVar15 = paVar1->prefix[2];
                uVar18 = paVar1->prefix[3];
                substring_00.value.pointer.prefix[3] = uVar18;
                substring_00.value.pointer.prefix[2] = uVar15;
                substring_00.value.pointer.prefix[1] = uVar12;
                substring_00.value.pointer.prefix[0] = uVar9;
                substring_00.value.pointer.length = uVar3;
                iVar21 = 0;
                if ((uint)uVar3 <= (uint)*(undefined8 *)&rdata->value) {
                  substring_00.value.pointer.ptr = *ppcVar26;
                  bits_00.value.pointer.ptr = (rdata->value).pointer.ptr;
                  bits_00.value._0_8_ = *(undefined8 *)&rdata->value;
                  iVar22 = Bit::BitPosition(substring_00,bits_00);
                  iVar21 = (int)iVar22;
                }
                result_data[uVar25 + uVar28] = iVar21;
              }
              uVar28 = uVar28 + 1;
              ppcVar26 = ppcVar26 + 2;
              uVar20 = uVar27;
            } while (uVar27 - uVar25 != uVar28);
          }
        }
      }
      uVar25 = uVar20;
      uVar24 = uVar24 + 1;
    } while (uVar24 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}